

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O2

adjusted_mantissa fast_float::positive_digit_comp<float>(bigint *bigmant,int32_t exponent)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  double in_XMM0_Qa;
  adjusted_mantissa aVar6;
  anon_class_1_1_756fe65e local_22;
  bool truncated;
  adjusted_mantissa local_20;
  
  bigint::pow10(bigmant,in_XMM0_Qa);
  local_20.mantissa = bigint::hi64(bigmant,&truncated);
  iVar1 = bigint::bit_length(bigmant);
  local_20.power2 = iVar1 + 0x56;
  local_22.truncated = truncated;
  if (iVar1 < -0x7d) {
    uVar4 = 0x40;
    if (-iVar1 - 0x55U < 0x40) {
      uVar4 = -iVar1 - 0x55U;
    }
    positive_digit_comp<float>::anon_class_1_1_756fe65e::operator()(&local_22,&local_20,uVar4);
    uVar5 = (ulong)(0x7fffff < local_20.mantissa);
  }
  else {
    positive_digit_comp<float>::anon_class_1_1_756fe65e::operator()(&local_22,&local_20,0x28);
    uVar2 = (ulong)((uint)local_20.mantissa & 0x7fffff);
    if (local_20.mantissa >= 0x1000000) {
      uVar2 = 0;
    }
    uVar3 = (local_20.power2 + 1) - (uint)(local_20.mantissa < 0x1000000);
    uVar4 = uVar3;
    if (0xfe < (int)uVar3) {
      uVar4 = 0xff;
    }
    uVar5 = (ulong)uVar4;
    local_20.mantissa = uVar2;
    if (0xfe < (int)uVar3) {
      local_20.mantissa = 0;
    }
  }
  aVar6._8_8_ = uVar5;
  aVar6.mantissa = local_20.mantissa;
  return aVar6;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa positive_digit_comp(bigint& bigmant, int32_t exponent) noexcept {
  FASTFLOAT_ASSERT(bigmant.pow10(uint32_t(exponent)));
  adjusted_mantissa answer;
  bool truncated;
  answer.mantissa = bigmant.hi64(truncated);
  int bias = binary_format<T>::mantissa_explicit_bits() - binary_format<T>::minimum_exponent();
  answer.power2 = bigmant.bit_length() - 64 + bias;

  round<T>(answer, [truncated](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [truncated](bool is_odd, bool is_halfway, bool is_above) -> bool {
      return is_above || (is_halfway && truncated) || (is_odd && is_halfway);
    });
  });

  return answer;
}